

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::getNewMaterial(ObjFileParser *this)

{
  char cVar1;
  Material *pMVar2;
  bool bVar3;
  uint uVar4;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var5;
  reference pcVar6;
  reference pcVar7;
  pointer pMVar8;
  Logger *this_00;
  bool local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Self local_90;
  _Self local_88;
  iterator it;
  allocator local_69;
  undefined1 local_68 [8];
  string strMat;
  char *pStart;
  ObjFileParser *this_local;
  
  _Var5 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var5._M_current;
  _Var5 = getNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var5._M_current;
  bVar3 = __gnu_cxx::operator==(&this->m_DataIt,&this->m_DataItEnd);
  if (!bVar3) {
    pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    strMat.field_2._8_8_ = pcVar6;
    pcVar7 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    cVar1 = *pcVar7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_68,pcVar6,(long)cVar1,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&this->m_DataIt,&this->m_DataItEnd);
      local_e9 = false;
      if (bVar3) {
        pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&this->m_DataIt);
        local_e9 = IsSpaceOrNewLine<char>(*pcVar6);
      }
      if (local_e9 == false) break;
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&this->m_DataIt);
    }
    pMVar8 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
         ::find(&pMVar8->m_MaterialMap,(key_type *)local_68);
    pMVar8 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    local_90._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
         ::end(&pMVar8->m_MaterialMap);
    bVar3 = std::operator==(&local_88,&local_90);
    if (bVar3) {
      this_00 = DefaultLogger::get();
      std::operator+(&local_b0,"OBJ: Unsupported material requested: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      Logger::warn(this_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      pMVar8 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar2 = pMVar8->m_pDefaultMaterial;
      pMVar8 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar8->m_pCurrentMaterial = pMVar2;
    }
    else {
      bVar3 = needsNewMesh(this,(string *)local_68);
      if (bVar3) {
        createMesh(this,(string *)local_68);
      }
      uVar4 = getMaterialIndex(this,(string *)local_68);
      pMVar8 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar8->m_pCurrentMesh->m_uiMaterialIndex = uVar4;
    }
    _Var5 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
    (this->m_DataIt)._M_current = _Var5._M_current;
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

void ObjFileParser::getNewMaterial() {
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    m_DataIt = getNextWord<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }

    char *pStart = &(*m_DataIt);
    std::string strMat( pStart, *m_DataIt );
    while( m_DataIt != m_DataItEnd && IsSpaceOrNewLine( *m_DataIt ) ) {
        ++m_DataIt;
    }
    std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find( strMat );
    if ( it == m_pModel->m_MaterialMap.end() ) {
        // Show a warning, if material was not found
        ASSIMP_LOG_WARN("OBJ: Unsupported material requested: " + strMat);
        m_pModel->m_pCurrentMaterial = m_pModel->m_pDefaultMaterial;
    } else {
        // Set new material
        if ( needsNewMesh( strMat ) ) {
            createMesh( strMat );
        }
        m_pModel->m_pCurrentMesh->m_uiMaterialIndex = getMaterialIndex( strMat );
    }

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}